

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::detail::
       parse_align<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  basic_format_specs<char> *pbVar1;
  char *in_RAX;
  byte *pbVar2;
  byte *pbVar3;
  format_error *this;
  ulong uVar4;
  char *unaff_RBX;
  byte bVar5;
  size_t i;
  ulong uVar6;
  bool bVar7;
  
  if (begin == end) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  pbVar3 = (byte *)(begin + 1);
  pbVar2 = pbVar3;
  if ((*begin < '\0') && (pbVar2 = (byte *)end, pbVar3 != (byte *)end)) {
    pbVar2 = pbVar3;
  }
  if (pbVar2 == (byte *)end) {
    pbVar2 = (byte *)begin;
  }
  do {
    bVar5 = *pbVar2;
    if (0x3d < bVar5) {
      if (bVar5 == 0x3e) {
        bVar5 = 2;
      }
      else {
        if (bVar5 != 0x5e) goto LAB_0010dd3b;
        bVar5 = 3;
      }
LAB_0010dd5d:
      bVar7 = false;
LAB_0010dd60:
      pbVar3 = (byte *)begin;
      if (pbVar2 != (byte *)begin) {
        if (*begin == '{') {
          error_handler::on_error((error_handler *)begin,"invalid fill character \'{\'");
        }
        uVar4 = (long)pbVar2 - (long)begin;
        if ((long)uVar4 < 0) {
          assert_fail(unaff_RBX,0,in_RAX);
        }
        if (4 < uVar4) {
          this = (format_error *)__cxa_allocate_exception(0x10);
          format_error::format_error(this,"invalid fill");
          __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
        }
        pbVar1 = (handler->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_;
        uVar6 = 0;
        do {
          (pbVar1->fill).data_[uVar6] = begin[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        (pbVar1->fill).size_ = (uchar)uVar4;
        pbVar3 = pbVar2;
      }
      if ((bVar7) && (bVar5 = 4, 10 < (handler->checker_).arg_type_ - int_type)) {
        error_handler::on_error((error_handler *)begin,"format specifier requires numeric argument")
        ;
      }
      pbVar1 = (handler->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar1->field_0x9 = pbVar1->field_0x9 & 0xf0 | bVar5;
      return (char *)(pbVar3 + 1);
    }
    if (bVar5 == 0x3c) {
      bVar5 = 1;
      goto LAB_0010dd5d;
    }
    if (bVar5 == 0x3d) {
      bVar5 = 4;
      bVar7 = true;
      goto LAB_0010dd60;
    }
LAB_0010dd3b:
    bVar7 = pbVar2 == (byte *)begin;
    pbVar2 = (byte *)begin;
    if (bVar7) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = next_code_point(begin, end);
  if (p == end) p = begin;
  for (;;) {
    switch (static_cast<char>(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}